

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O1

void proc_reloc(void)

{
  t_proc *ptVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  t_symbol *ptVar5;
  t_symbol *ptVar6;
  int iVar7;
  
  iVar2 = bank_limit;
  if (proc_nb != 0) {
    proc_ptr = proc_first;
    iVar4 = max_bank + 1;
    bank = iVar4;
    if (proc_first != (t_proc *)0x0) {
      iVar7 = 0;
      do {
        ptVar1 = proc_ptr->group;
        if (ptVar1 == (t_proc *)0x0) {
          if (0x2000 < proc_ptr->size + iVar7) {
            iVar4 = iVar4 + 1;
            iVar7 = 0;
            bank = iVar4;
          }
          if (iVar2 < iVar4) {
            fatal_error("Not enough ROM space for procs!");
            return;
          }
          proc_ptr->bank = iVar4;
          proc_ptr->org = iVar7;
          iVar7 = iVar7 + proc_ptr->size;
        }
        else {
          proc_ptr->bank = iVar4;
          proc_ptr->org = proc_ptr->org + (ptVar1->org - ptVar1->base);
        }
        max_bank = iVar4;
        proc_ptr->refcnt = 0;
        proc_ptr = proc_ptr->link;
      } while (proc_ptr != (t_proc *)0x0);
    }
    lVar3 = 0;
    do {
      for (ptVar5 = hash_tbl[lVar3]; ptVar5 != (t_symbol *)0x0; ptVar5 = ptVar5->next) {
        ptVar1 = ptVar5->proc;
        proc_ptr = ptVar1;
        if (ptVar1 != (t_proc *)0x0) {
          ptVar5->bank = ptVar1->bank;
          ptVar5->value = ptVar5->value + (ptVar1->org - ptVar1->base);
          for (ptVar6 = ptVar5->local; ptVar6 != (t_symbol *)0x0; ptVar6 = ptVar6->next) {
            ptVar1 = ptVar6->proc;
            proc_ptr = ptVar1;
            if (ptVar1 != (t_proc *)0x0) {
              ptVar6->bank = ptVar1->bank;
              ptVar6->value = ptVar6->value + (ptVar1->org - ptVar1->base);
            }
          }
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    lablset("_call_bank",bank_base + max_bank + 1);
    proc_ptr = (t_proc *)0x0;
    proc_nb = 0;
  }
  return;
}

Assistant:

void
proc_reloc(void)
{
	struct t_symbol *sym;
	struct t_symbol *local;
	struct t_proc   *group;
	int i;
	int addr;
	int tmp;

	if (proc_nb == 0)
		return;

	/* init */
	proc_ptr = proc_first;
	bank = max_bank + 1;
	addr = 0;

	/* alloc memory */
	while (proc_ptr) {
		/* proc */
		if (proc_ptr->group == NULL) {
			tmp = addr + proc_ptr->size;
	
			/* bank change */
			if (tmp > 0x2000) {
				bank++;
				addr = 0;
			}
			if (bank > bank_limit) {
				fatal_error("Not enough ROM space for procs!");
				return;
			}

			/* reloc proc */
			proc_ptr->bank = bank;
			proc_ptr->org = addr;
			addr += proc_ptr->size;
		}

		/* group */
		else {
			/* reloc proc */
			group = proc_ptr->group;
			proc_ptr->bank = bank;
			proc_ptr->org += (group->org - group->base);
		}

		/* next */
		max_bank = bank;
		proc_ptr->refcnt = 0;
		proc_ptr = proc_ptr->link;
	}

	/* remap proc symbols */
	for (i = 0; i < 256; i++) {
		sym = hash_tbl[i];

		while (sym) {
			proc_ptr = sym->proc;

			/* remap addr */
			if (sym->proc) {
				sym->bank   =  proc_ptr->bank;
				sym->value += (proc_ptr->org - proc_ptr->base);

				/* local symbols */
				if (sym->local) {
					local = sym->local;
	
					while (local) {
						proc_ptr = local->proc;
			
						/* remap addr */
						if (local->proc) {
							local->bank   =  proc_ptr->bank;
							local->value += (proc_ptr->org - proc_ptr->base);
						}
		
						/* next */
						local = local->next;
					}
				}
			}

			/* next */
			sym = sym->next;
		}
	}

	/* reserve call bank */
	lablset("_call_bank", bank_base + max_bank + 1);

	/* reset */
	proc_ptr = NULL;
	proc_nb = 0;
}